

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ObjectivePropagation::ObjectivePropagation
          (ObjectivePropagation *this,HighsDomain *domain)

{
  int iVar1;
  value_type vVar2;
  pointer pHVar3;
  double *pdVar4;
  vector<double,_std::allocator<double>_> *__x;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  reference pvVar5;
  uint *puVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  size_type sVar10;
  char *__to;
  char *__to_00;
  HighsDomain *in_RSI;
  ObjectivePropagation *in_RDI;
  HighsInt col_1;
  HighsInt i_1;
  HighsInt numObjNz;
  HighsInt worstPos;
  HighsInt col;
  HighsInt j;
  ObjectiveContributionTree contributionTree;
  HighsInt i;
  HighsInt numPartitions;
  vector<int,_std::allocator<int>_> *partitionStarts;
  vector<int,_std::allocator<int>_> *objNonzeros;
  int *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  LinkType in_stack_fffffffffffffed4;
  ObjectivePropagation *in_stack_fffffffffffffed8;
  ObjectiveContributionTree *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int iVar11;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  uint uVar12;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__new_size;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_7c;
  CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> local_78;
  int local_5c;
  undefined4 local_58;
  undefined4 local_54;
  pair<int,_int> local_50;
  HighsCDouble local_48;
  HighsInt local_34;
  vector<int,_std::allocator<int>_> *local_30;
  vector<double,_std::allocator<double>_> *local_18;
  HighsDomain *local_10;
  
  in_RDI->domain = in_RSI;
  local_10 = in_RSI;
  pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5be55d);
  in_RDI->objFunc = &pHVar3->objectiveFunction;
  pdVar4 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x5be58f);
  in_RDI->cost = pdVar4;
  std::
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ::vector((vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
            *)0x5be5a9);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x5be5c2);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x5be5db);
  std::
  vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ::vector((vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
            *)0x5be5f7);
  __x = (vector<double,_std::allocator<double>_> *)
        HighsObjectiveFunction::getObjectiveNonzeros(in_RDI->objFunc);
  local_18 = __x;
  local_30 = HighsObjectiveFunction::getCliquePartitionStarts(in_RDI->objFunc);
  local_34 = HighsObjectiveFunction::getNumCliquePartitions((HighsObjectiveFunction *)0x5be658);
  if (local_34 != 0) {
    HighsObjectiveFunction::getObjectiveValuesPacked(in_RDI->objFunc);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),__x);
    HighsObjectiveFunction::getNumCliquePartitions((HighsObjectiveFunction *)0x5be6c7);
    std::
    vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
    ::resize((vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
              *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  in_RDI->isPropagated = false;
  in_RDI->capacityThreshold = INFINITY;
  HighsCDouble::HighsCDouble(&local_48,0.0);
  (in_RDI->objectiveLower).hi = local_48.hi;
  (in_RDI->objectiveLower).lo = local_48.lo;
  in_RDI->numInfObjLower = 0;
  std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_34);
  std::
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ::resize((vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
            *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  __new_size = &in_RDI->contributionPartitionSets;
  this_00 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(long)local_34;
  local_54 = 0xffffffff;
  local_58 = 0xffffffff;
  local_50 = std::make_pair<int,int>(in_stack_fffffffffffffec8,(int *)0x5be7e9);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
            (this_00,(size_type)__new_size,
             (value_type *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  for (local_5c = 0; local_5c < local_34; local_5c = local_5c + 1) {
    ObjectiveContributionTree::ObjectiveContributionTree
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    pvVar5 = std::
             vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
             ::operator[](&in_RDI->partitionCliqueData,(long)local_5c);
    pvVar5->rhs = 1;
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_5c);
    local_7c = *puVar6;
    while (uVar12 = local_7c,
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)(local_5c + 1))
          , (int)uVar12 < *pvVar7) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_18,(long)(int)local_7c);
      iVar1 = *pvVar7;
      iVar11 = iVar1;
      pvVar8 = std::
               vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
               ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_7c);
      pvVar8->col = iVar11;
      iVar11 = local_5c;
      pvVar8 = std::
               vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
               ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_7c);
      pvVar8->partition = iVar11;
      if (in_RDI->cost[iVar1] <= 0.0) {
        in_stack_fffffffffffffed8 =
             (ObjectivePropagation *)((ulong)in_RDI->cost[iVar1] ^ 0x8000000000000000);
        pvVar8 = std::
                 vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                 ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_7c);
        pvVar8->contribution = (double)in_stack_fffffffffffffed8;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_10->col_upper_,(long)iVar1);
        if ((*pvVar9 == 1.0) && (!NAN(*pvVar9))) {
          ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::link
                    (&local_78.
                      super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>,
                     (char *)(ulong)local_7c,__to_00);
        }
      }
      else {
        HighsCDouble::operator+=
                  ((HighsCDouble *)in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8);
        in_stack_fffffffffffffee0 = (ObjectiveContributionTree *)in_RDI->cost[iVar1];
        pvVar8 = std::
                 vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                 ::operator[](&in_RDI->objectiveLowerContributions,(long)(int)local_7c);
        pvVar8->contribution = (double)in_stack_fffffffffffffee0;
        pvVar5 = std::
                 vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                 ::operator[](&in_RDI->partitionCliqueData,(long)local_5c);
        pvVar5->rhs = pvVar5->rhs + -1;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_10->col_lower_,(long)iVar1);
        if ((*pvVar9 == 0.0) && (!NAN(*pvVar9))) {
          ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::link
                    (&local_78.
                      super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>,
                     (char *)(ulong)local_7c,__to);
        }
      }
      local_7c = local_7c + 1;
    }
    in_stack_fffffffffffffed4 =
         ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::
         first(&local_78);
    if (in_stack_fffffffffffffed4 != -1) {
      std::
      vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
      ::operator[](&in_RDI->objectiveLowerContributions,(long)in_stack_fffffffffffffed4);
      HighsCDouble::operator-=
                ((HighsCDouble *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (double)in_stack_fffffffffffffec8);
    }
  }
  sVar10 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_18);
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_34);
  for (vVar2 = *pvVar7; vVar2 < (int)sVar10; vVar2 = vVar2 + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_18,(long)vVar2);
    in_stack_ffffffffffffff70 = *pvVar7;
    if (in_RDI->cost[in_stack_ffffffffffffff70] <= 0.0) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_10->col_upper_,(long)in_stack_ffffffffffffff70);
      if ((*pvVar9 != INFINITY) || (NAN(*pvVar9))) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&local_10->col_upper_,(long)in_stack_ffffffffffffff70);
        HighsCDouble::operator+=
                  ((HighsCDouble *)in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8);
      }
      else {
        in_RDI->numInfObjLower = in_RDI->numInfObjLower + 1;
      }
    }
    else {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_10->col_lower_,(long)in_stack_ffffffffffffff70);
      if ((*pvVar9 != -INFINITY) || (NAN(*pvVar9))) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&local_10->col_lower_,(long)in_stack_ffffffffffffff70);
        HighsCDouble::operator+=
                  ((HighsCDouble *)in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8);
      }
      else {
        in_RDI->numInfObjLower = in_RDI->numInfObjLower + 1;
      }
    }
  }
  recomputeCapacityThreshold((ObjectivePropagation *)CONCAT44(vVar2,in_stack_ffffffffffffff70));
  debugCheckObjectiveLower(in_RDI);
  return;
}

Assistant:

HighsDomain::ObjectivePropagation::ObjectivePropagation(HighsDomain* domain)
    : domain(domain),
      objFunc(&domain->mipsolver->mipdata_->objectiveFunction),
      cost(domain->mipsolver->model_->col_cost_.data()) {
  const auto& objNonzeros = objFunc->getObjectiveNonzeros();
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();

  HighsInt numPartitions = objFunc->getNumCliquePartitions();

  if (numPartitions != 0) {
    propagationConsBuffer = objFunc->getObjectiveValuesPacked();
    partitionCliqueData.resize(objFunc->getNumCliquePartitions());
  }

  isPropagated = false;
  capacityThreshold = kHighsInf;
  objectiveLower = 0.0;
  numInfObjLower = 0;
  objectiveLowerContributions.resize(partitionStarts[numPartitions]);
  contributionPartitionSets.resize(numPartitions,
                                   std::make_pair(HighsInt{-1}, HighsInt{-1}));

  // for each clique partition first set up all columns as contributing with
  // their largest possible value and then remove the largest contribution of
  // each clique partition. For these columns we do not need to check for finite
  // bounds as they must be binary. We do not assume, however, that they must be
  // unfixed but could be fixed to 0 or 1. We maintain a heap that fulfills the
  // invariant that the largest column may be not fixed to its value with the
  // larger contribution.
  for (HighsInt i = 0; i < numPartitions; ++i) {
    ObjectiveContributionTree contributionTree(this, i);
    partitionCliqueData[i].rhs = 1;
    for (HighsInt j = partitionStarts[i]; j < partitionStarts[i + 1]; ++j) {
      HighsInt col = objNonzeros[j];
      objectiveLowerContributions[j].col = col;
      objectiveLowerContributions[j].partition = i;
      if (cost[col] > 0.0) {
        objectiveLower += cost[col];
        objectiveLowerContributions[j].contribution = cost[col];
        partitionCliqueData[i].rhs -= 1;
        if (domain->col_lower_[col] == 0.0) contributionTree.link(j);
      } else {
        objectiveLowerContributions[j].contribution = -cost[col];
        if (domain->col_upper_[col] == 1.0) contributionTree.link(j);
      }
    }

    HighsInt worstPos = contributionTree.first();
    if (worstPos != -1)
      objectiveLower -= objectiveLowerContributions[worstPos].contribution;
  }

  // add contribution of remaining objective nonzeros
  const HighsInt numObjNz = objNonzeros.size();
  for (HighsInt i = partitionStarts[numPartitions]; i < numObjNz; ++i) {
    HighsInt col = objNonzeros[i];
    if (cost[col] > 0.0) {
      if (domain->col_lower_[col] == -kHighsInf)
        ++numInfObjLower;
      else
        objectiveLower += domain->col_lower_[col] * cost[col];
    } else {
      if (domain->col_upper_[col] == kHighsInf)
        ++numInfObjLower;
      else
        objectiveLower += domain->col_upper_[col] * cost[col];
    }
  }

  recomputeCapacityThreshold();
  debugCheckObjectiveLower();
}